

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericitemmodel.cpp
# Opt level: O2

QMap<int,_QVariant> __thiscall
QGenericItemModel::itemData(QGenericItemModel *this,QModelIndex *index)

{
  QGenericItemModelImplBase::callConst<QMap<int,QVariant>,QModelIndex>
            ((QGenericItemModelImplBase *)this,(ConstOp)(index->m).ptr,(QModelIndex *)0x8);
  return (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
          )(QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
            )this;
}

Assistant:

QMap<int, QVariant> QGenericItemModel::itemData(const QModelIndex &index) const
{
    return impl->callConst<QMap<int, QVariant>>(QGenericItemModelImplBase::ItemData, index);
}